

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::str_format_internal::BufferRawSink::Write(BufferRawSink *this,string_view v)

{
  char *__dest;
  unsigned_long *puVar1;
  const_pointer __src;
  size_type sVar2;
  size_type local_30;
  size_t local_28;
  size_t to_write;
  BufferRawSink *this_local;
  string_view v_local;
  
  v_local._M_len = (size_t)v._M_str;
  this_local = (BufferRawSink *)v._M_len;
  to_write = (size_t)this;
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  puVar1 = std::min<unsigned_long>(&local_30,&this->size_);
  local_28 = *puVar1;
  __dest = this->buffer_;
  __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  memcpy(__dest,__src,local_28);
  this->buffer_ = this->buffer_ + local_28;
  this->size_ = this->size_ - local_28;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  this->total_written_ = sVar2 + this->total_written_;
  return;
}

Assistant:

void BufferRawSink::Write(string_view v) {
  size_t to_write = std::min(v.size(), size_);
  std::memcpy(buffer_, v.data(), to_write);
  buffer_ += to_write;
  size_ -= to_write;
  total_written_ += v.size();
}